

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O2

gravity_closure_t * gravity_class_lookup_constructor(gravity_class_t *c,uint32_t nparams)

{
  uint32_t len;
  size_t sVar1;
  gravity_object_t *pgVar2;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar3;
  char *key;
  gravity_value_t key_00;
  gravity_class_t *local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  char *local_140;
  uint32_t local_138;
  uint32_t local_134;
  undefined4 local_130;
  char name [256];
  
  if (c->xdata == (void *)0x0) {
    key = "init";
    name._48_8_ = (long)"$init" + 1;
    name[0x3c] = '\x04';
    name[0x3d] = '\0';
    name[0x3e] = '\0';
    name[0x3f] = '\0';
    name[0x40] = '\0';
    name[0x41] = '\0';
    name[0x42] = '\0';
    name[0x43] = '\0';
    len = 4;
  }
  else {
    if (nparams != 0) {
      snprintf(name,0x100,"%s%d","$init",(ulong)nparams);
      aVar3.p = (gravity_object_t *)&local_170;
      local_170 = gravity_class_string;
      local_168 = 0;
      uStack_160 = 0;
      local_158 = 0;
      uStack_150 = 0;
      local_148 = 0;
      local_140 = name;
      sVar1 = strlen(name);
      local_134 = (uint32_t)sVar1;
      local_130 = 0;
      local_138 = gravity_hash_compute_buffer(name,local_134);
      goto LAB_0013464d;
    }
    key = "$init";
    name._48_8_ = anon_var_dwarf_2b5a;
    name[0x3c] = '\x05';
    name[0x3d] = '\0';
    name[0x3e] = '\0';
    name[0x3f] = '\0';
    name[0x40] = '\0';
    name[0x41] = '\0';
    name[0x42] = '\0';
    name[0x43] = '\0';
    len = 5;
  }
  name[0x28] = '\0';
  name[0x29] = '\0';
  name[0x2a] = '\0';
  name[0x2b] = '\0';
  name[0x2c] = '\0';
  name[0x2d] = '\0';
  name[0x2e] = '\0';
  name[0x2f] = '\0';
  name[0x20] = '\0';
  name[0x21] = '\0';
  name[0x22] = '\0';
  name[0x23] = '\0';
  name[0x24] = '\0';
  name[0x25] = '\0';
  name[0x26] = '\0';
  name[0x27] = '\0';
  name[0x18] = '\0';
  name[0x19] = '\0';
  name[0x1a] = '\0';
  name[0x1b] = '\0';
  name[0x1c] = '\0';
  name[0x1d] = '\0';
  name[0x1e] = '\0';
  name[0x1f] = '\0';
  name[0x10] = '\0';
  name[0x11] = '\0';
  name[0x12] = '\0';
  name[0x13] = '\0';
  name[0x14] = '\0';
  name[0x15] = '\0';
  name[0x16] = '\0';
  name[0x17] = '\0';
  name[8] = '\0';
  name[9] = '\0';
  name[10] = '\0';
  name[0xb] = '\0';
  name[0xc] = '\0';
  name[0xd] = '\0';
  name[0xe] = '\0';
  name[0xf] = '\0';
  name._0_8_ = gravity_class_string;
  aVar3.p = (gravity_object_t *)name;
  name._56_4_ = gravity_hash_compute_buffer(key,len);
LAB_0013464d:
  key_00.field_1.n = aVar3.n;
  key_00.isa = gravity_class_string;
  pgVar2 = gravity_class_lookup(c,key_00);
  return (gravity_closure_t *)pgVar2;
}

Assistant:

inline gravity_closure_t *gravity_class_lookup_constructor (gravity_class_t *c, uint32_t nparams) {
    if (c->xdata) {
        // bridged class so check for special $initN function
        if (nparams == 0) {
            STATICVALUE_FROM_STRING(key, CLASS_INTERNAL_INIT_NAME, strlen(CLASS_INTERNAL_INIT_NAME));
            return (gravity_closure_t *)gravity_class_lookup(c, key);
        }

        // for bridged classed (which can have more than one init constructor like in objc) the convention is
        // to map each bridged init with a special $initN function (where N>0 is num params)
        char name[256]; snprintf(name, sizeof(name), "%s%d", CLASS_INTERNAL_INIT_NAME, nparams);
        STATICVALUE_FROM_STRING(key, name, strlen(name));
        return (gravity_closure_t *)gravity_class_lookup(c, key);
    }

    // for non bridge classes just check for constructor
    STATICVALUE_FROM_STRING(key, CLASS_CONSTRUCTOR_NAME, strlen(CLASS_CONSTRUCTOR_NAME));
    return (gravity_closure_t *)gravity_class_lookup(c, key);
}